

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# activity_tracking.hpp
# Opt level: O1

void __thiscall
so_5::stats::activity_tracking_stuff::
stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock>::stop
          (stats_collector_t<so_5::stats::activity_tracking_stuff::null_lock> *this)

{
  duration_t *pdVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  this->m_is_in_working = false;
  lVar2 = (this->m_work_started_at).__d.__r;
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar4 = lVar4 - lVar2;
  pdVar1 = &(this->m_work_activity).m_total_time;
  pdVar1->__r = pdVar1->__r + lVar4;
  uVar3 = (this->m_work_activity).m_count;
  iVar6 = 1;
  if (uVar3 != 0) {
    iVar6 = (int)uVar3;
  }
  iVar5 = 100;
  if (uVar3 < 0x65) {
    iVar5 = iVar6;
  }
  (this->m_work_activity).m_avg_time.__r =
       (lVar4 + (long)(iVar5 + -1) * (this->m_work_activity).m_avg_time.__r) / (long)iVar5;
  return;
}

Assistant:

void
		stop()
			{
				typename LOCK_HOLDER::start_stop_lock_t lock{ lock_holder() };

				m_is_in_working = false;
				so_5::stats::details::update_stats_from_current_time(
						m_work_activity,
						m_work_started_at );
			}